

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  DPIImportSyntax *pDVar1;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000010;
  Token *in_stack_00000018;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000020;
  BumpAllocator *in_stack_00000028;
  Token *in_stack_00000050;
  FunctionPrototypeSyntax *in_stack_00000058;
  Token *in_stack_00000060;
  BumpAllocator *in_stack_000000a8;
  Token *in_stack_000000b0;
  BumpAllocator *in_stack_ffffffffffffff58;
  FunctionPrototypeSyntax *in_stack_ffffffffffffff60;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>
            (in_stack_00000010,(BumpAllocator *)in_stack_00000008);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator*
            ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0xa31244);
  deepClone<slang::syntax::FunctionPrototypeSyntax>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DPIImportSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::FunctionPrototypeSyntax&,slang::parsing::Token>
                     (in_stack_00000028,in_stack_00000020,in_stack_00000018,
                      (Token *)in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_00000050,
                      in_stack_00000058,in_stack_00000060);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DPIImportSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DPIImportSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.specString.deepClone(alloc),
        node.property.deepClone(alloc),
        node.c_identifier.deepClone(alloc),
        node.equals.deepClone(alloc),
        *deepClone<FunctionPrototypeSyntax>(*node.method, alloc),
        node.semi.deepClone(alloc)
    );
}